

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

ExactFloat __thiscall ExactFloat::RoundToMaxPrec(ExactFloat *this,int max_prec,RoundingMode mode)

{
  int iVar1;
  ostream *poVar2;
  BIGNUM *extraout_RDX;
  undefined4 in_register_00000034;
  ExactFloat *this_00;
  ExactFloat EVar4;
  int shift;
  S2LogMessageVoidify local_4d [20];
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21 [5];
  RoundingMode local_1c;
  RoundingMode mode_local;
  int max_prec_local;
  ExactFloat *this_local;
  BigNum BVar3;
  
  this_00 = (ExactFloat *)CONCAT44(in_register_00000034,max_prec);
  local_39 = 0;
  local_1c = mode;
  _mode_local = this_00;
  this_local = this;
  if ((int)mode < 2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x10d,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar2 = S2LogMessage::stream(&local_38);
    poVar2 = std::operator<<(poVar2,"Check failed: (max_prec) >= (2) ");
    S2LogMessageVoidify::operator&(local_21,poVar2);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  if (0x4000000 < (int)local_1c) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&shift,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x10e,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream((S2LogMessage *)&shift);
    poVar2 = std::operator<<(poVar2,"Check failed: (max_prec) <= (kMaxPrec) ");
    S2LogMessageVoidify::operator&(local_4d,poVar2);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&shift);
  }
  iVar1 = prec(this_00);
  if ((int)(iVar1 - local_1c) < 1) {
    ExactFloat(this,this_00);
    BVar3.bn_ = extraout_RDX;
  }
  else {
    EVar4 = RoundToPowerOf2(this,max_prec,this_00->bn_exp_ + (iVar1 - local_1c));
    BVar3 = EVar4.bn_.bn_;
  }
  EVar4.bn_.bn_ = BVar3.bn_;
  EVar4._0_8_ = this;
  return EVar4;
}

Assistant:

ExactFloat ExactFloat::RoundToMaxPrec(int max_prec, RoundingMode mode) const {
  // The "kRoundTiesToEven" mode requires at least 2 bits of precision
  // (otherwise both adjacent representable values may be odd).
  S2_DCHECK_GE(max_prec, 2);
  S2_DCHECK_LE(max_prec, kMaxPrec);

  // The following test also catches zero, infinity, and NaN.
  int shift = prec() - max_prec;
  if (shift <= 0) return *this;

  // Round by removing the appropriate number of bits from the mantissa.  Note
  // that if the value is rounded up to a power of 2, the high-order bit
  // position may increase, but in that case Canonicalize() will remove at
  // least one zero bit and so the output will still have prec() <= max_prec.
  return RoundToPowerOf2(bn_exp_ + shift, mode);
}